

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O2

int mbedtls_gcm_update(mbedtls_gcm_context *ctx,uchar *input,size_t input_length,uchar *output,
                      size_t output_size,size_t *output_length)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong offset;
  ulong use_len;
  uchar ectr [16];
  
  ectr[0] = '\0';
  ectr[1] = '\0';
  ectr[2] = '\0';
  ectr[3] = '\0';
  ectr[4] = '\0';
  ectr[5] = '\0';
  ectr[6] = '\0';
  ectr[7] = '\0';
  ectr[8] = '\0';
  ectr[9] = '\0';
  ectr[10] = '\0';
  ectr[0xb] = '\0';
  ectr[0xc] = '\0';
  ectr[0xd] = '\0';
  ectr[0xe] = '\0';
  ectr[0xf] = '\0';
  if (output_size < input_length) {
    return -0x16;
  }
  *output_length = input_length;
  if (input_length == 0) {
    return 0;
  }
  if (input < output && (ulong)((long)output - (long)input) < input_length) {
    return -0x14;
  }
  uVar3 = ctx->len;
  if (0xfffffffe0 < uVar3 + input_length || CARRY8(uVar3,input_length)) {
    return -0x14;
  }
  if (uVar3 == 0) {
    if ((ctx->add_len & 0xf) == 0) {
      uVar3 = 0;
      goto LAB_01b780e6;
    }
    gcm_mult(ctx,ctx->buf,ctx->buf);
    uVar3 = ctx->len;
  }
  offset = uVar3 & 0xf;
  if (offset != 0) {
    use_len = 0x10 - offset;
    if (input_length <= 0x10 - offset) {
      use_len = input_length;
    }
    iVar1 = gcm_mask(ctx,ectr,offset,use_len,input,output);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (offset + use_len == 0x10) {
      gcm_mult(ctx,ctx->buf,ctx->buf);
    }
    uVar3 = ctx->len + use_len;
    input_length = input_length - use_len;
    input = input + use_len;
    output = output + use_len;
  }
LAB_01b780e6:
  ctx->len = uVar3 + input_length;
  for (; 0xf < input_length; input_length = input_length - 0x10) {
    uVar2 = *(uint *)(ctx->y + 0xc);
    uVar2 = (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) + 1;
    *(uint *)(ctx->y + 0xc) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 * 0x1000000;
    iVar1 = gcm_mask(ctx,ectr,0,0x10,input,output);
    if (iVar1 != 0) {
      return iVar1;
    }
    gcm_mult(ctx,ctx->buf,ctx->buf);
    input = input + 0x10;
    output = output + 0x10;
  }
  if (input_length != 0) {
    uVar2 = *(uint *)(ctx->y + 0xc);
    uVar2 = (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) + 1;
    *(uint *)(ctx->y + 0xc) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 * 0x1000000;
    iVar1 = gcm_mask(ctx,ectr,0,input_length,input,output);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  mbedtls_platform_zeroize(ectr,0x10);
  return 0;
}

Assistant:

int mbedtls_gcm_update(mbedtls_gcm_context *ctx,
                       const unsigned char *input, size_t input_length,
                       unsigned char *output, size_t output_size,
                       size_t *output_length)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const unsigned char *p = input;
    unsigned char *out_p = output;
    size_t offset;
    unsigned char ectr[16] = { 0 };

    if (output_size < input_length) {
        return MBEDTLS_ERR_GCM_BUFFER_TOO_SMALL;
    }
    *output_length = input_length;

    /* Exit early if input_length==0 so that we don't do any pointer arithmetic
     * on a potentially null pointer.
     * Returning early also means that the last partial block of AD remains
     * untouched for mbedtls_gcm_finish */
    if (input_length == 0) {
        return 0;
    }

    if (output > input && (size_t) (output - input) < input_length) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    /* Total length is restricted to 2^39 - 256 bits, ie 2^36 - 2^5 bytes
     * Also check for possible overflow */
    if (ctx->len + input_length < ctx->len ||
        (uint64_t) ctx->len + input_length > 0xFFFFFFFE0ull) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    if (ctx->len == 0 && ctx->add_len % 16 != 0) {
        gcm_mult(ctx, ctx->buf, ctx->buf);
    }

    offset = ctx->len % 16;
    if (offset != 0) {
        size_t use_len = 16 - offset;
        if (use_len > input_length) {
            use_len = input_length;
        }

        if ((ret = gcm_mask(ctx, ectr, offset, use_len, p, out_p)) != 0) {
            return ret;
        }

        if (offset + use_len == 16) {
            gcm_mult(ctx, ctx->buf, ctx->buf);
        }

        ctx->len += use_len;
        input_length -= use_len;
        p += use_len;
        out_p += use_len;
    }

    ctx->len += input_length;

    while (input_length >= 16) {
        gcm_incr(ctx->y);
        if ((ret = gcm_mask(ctx, ectr, 0, 16, p, out_p)) != 0) {
            return ret;
        }

        gcm_mult(ctx, ctx->buf, ctx->buf);

        input_length -= 16;
        p += 16;
        out_p += 16;
    }

    if (input_length > 0) {
        gcm_incr(ctx->y);
        if ((ret = gcm_mask(ctx, ectr, 0, input_length, p, out_p)) != 0) {
            return ret;
        }
    }

    mbedtls_platform_zeroize(ectr, sizeof(ectr));
    return 0;
}